

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ExtendsClauseSyntax::setChild
          (ExtendsClauseSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00af6698 + *(int *)(&DAT_00af6698 + in_RSI * 4)))();
  return;
}

Assistant:

void ExtendsClauseSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: keyword = child.token(); return;
        case 1: baseName = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        case 2: arguments = child.node() ? &child.node()->as<ArgumentListSyntax>() : nullptr; return;
        case 3: defaultedArg = child.node() ? &child.node()->as<DefaultExtendsClauseArgSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}